

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressRleLiteralsBlock(void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  int iVar1;
  uint uVar2;
  U32 flSize;
  BYTE *ostart;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  
  iVar1 = (uint)(0x1f < srcSize) - (uint)(srcSize < 0x1000);
  uVar2 = iVar1 + 2;
  if (uVar2 == 1) {
    *(char *)dst = (char)(srcSize << 3) + '\x01';
  }
  else if (uVar2 == 2) {
    MEM_writeLE16(dst,(short)(srcSize << 4) + 5);
  }
  else if (uVar2 == 3) {
    MEM_writeLE32(dst,(int)(srcSize << 4) + 0xd);
  }
  *(undefined1 *)((long)dst + (ulong)uVar2) = *src;
  return (ulong)(iVar1 + 3);
}

Assistant:

static size_t ZSTD_compressRleLiteralsBlock (void* dst, size_t dstCapacity, const void* src, size_t srcSize)
{
    BYTE* const ostart = (BYTE* const)dst;
    U32   const flSize = 1 + (srcSize>31) + (srcSize>4095);

    (void)dstCapacity;  /* dstCapacity already guaranteed to be >=4, hence large enough */

    switch(flSize)
    {
        case 1: /* 2 - 1 - 5 */
            ostart[0] = (BYTE)((U32)set_rle + (srcSize<<3));
            break;
        case 2: /* 2 - 2 - 12 */
            MEM_writeLE16(ostart, (U16)((U32)set_rle + (1<<2) + (srcSize<<4)));
            break;
        case 3: /* 2 - 2 - 20 */
            MEM_writeLE32(ostart, (U32)((U32)set_rle + (3<<2) + (srcSize<<4)));
            break;
        default:   /* not necessary : flSize is {1,2,3} */
            assert(0);
    }

    ostart[flSize] = *(const BYTE*)src;
    return flSize+1;
}